

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pdu.cc
# Opt level: O1

bool __thiscall assembler::SessionPDU::append(SessionPDU *this,TransportPDU *tpdu)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  uint b;
  const_iterator begin;
  ImageStructureHeader IVar5;
  
  puVar1 = (tpdu->header).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  b = (uint)puVar1[3] | (puVar1[2] & 0x3f) << 8;
  if ((this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar2 = (tpdu->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar1 = puVar2 + (ushort)((*(ushort *)(puVar1 + 4) << 8 | *(ushort *)(puVar1 + 4) >> 8) + 1);
    begin._M_current = puVar2 + 10;
    this->lastSequenceCount_ = b;
  }
  else {
    iVar4 = diffWithWrap<16384u>(this->lastSequenceCount_,b);
    if (1 < iVar4) {
      if ((((this->m_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
          ((this->ph_).fileType != '\0')) ||
         ((this->szParam_)._M_t.super___uniq_ptr_impl<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>.
          _M_t.super__Tuple_impl<0UL,_SZ_com_t_s_*,_std::default_delete<SZ_com_t_s>_>.
          super__Head_base<0UL,_SZ_com_t_s_*,_false>._M_head_impl == (SZ_com_t_s *)0x0)) {
        return false;
      }
      IVar5 = lrit::getHeader<lrit::ImageStructureHeader>(&this->buf_,&this->m_);
      if ((int)((IVar5._8_4_ & 0xffff) - this->linesDone_) < iVar4 + -1) {
        return false;
      }
      skipLines(this,iVar4 + -1);
    }
    this->lastSequenceCount_ = b;
    begin._M_current =
         (tpdu->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    puVar1 = (tpdu->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  bVar3 = append(this,begin,(const_iterator)(puVar1 + -2));
  return bVar3;
}

Assistant:

bool SessionPDU::append(const TransportPDU& tpdu) {
  auto sequenceCount = tpdu.sequenceCount();

  // First 10 bytes of the first TP_PDU appears to be garbage.
  // Last 2 bytes of every TP_PDU is a CRC.
  if (buf_.empty()) {
    auto begin = tpdu.data.begin() + 10;
    auto end = tpdu.data.begin() + tpdu.length() - 2;
    lastSequenceCount_ = sequenceCount;
    return append(begin, end);
  }

  // If one or more packets were skipped (dropped),
  // then we must figure out if it is OK synthesize contents
  // or if we must drop the entire session PDU.
  // This is only the case if the LRIT header was already received
  // and we're dealing with a line-by-line encoded image.
  auto skip = diffWithWrap<16384>(lastSequenceCount_, sequenceCount) - 1;
  if (skip > 0) {
    // Can't skip if the header is not yet complete.
    if (!hasCompleteHeader()) {
      return false;
    }

    // Can't skip if this is not an image
    if (ph_.fileType != 0) {
      return false;
    }

    // Can't skip if we don't know how many pixels to fill in
    if (!szParam_) {
      return false;
    }

    // Can't skip if we need to skip more lines than remaining
    auto ish = getHeader<lrit::ImageStructureHeader>();
    auto remaining = (int) ish.lines - (int) linesDone_;
    if (skip > remaining) {
      return false;
    }

    skipLines(skip);
  }

  lastSequenceCount_ = sequenceCount;
  return append(tpdu.data.begin(), tpdu.data.end() - 2);
}